

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O0

bool_t zzIsSumEq(word *c,word *a,word *b,size_t n)

{
  ulong uVar1;
  size_t i;
  word w;
  word carry;
  word diff;
  size_t n_local;
  word *b_local;
  word *a_local;
  word *c_local;
  
  diff = 0;
  carry = 0;
  for (i = 0; i < n; i = i + 1) {
    uVar1 = a[i] + carry;
    diff = c[i] ^ uVar1 + b[i] | diff;
    carry = (word)(int)(uint)(c[i] < uVar1 || uVar1 < carry);
  }
  return (bool_t)(diff == 0 && carry == 0);
}

Assistant:

bool_t SAFE(zzIsSumEq)(const word c[], const word a[], const word b[], 
	size_t n)
{
	register word diff = 0;
	register word carry = 0;
	register word w;
	size_t i;
	ASSERT(wwIsValid(a, n));
	ASSERT(wwIsValid(b, n));
	ASSERT(wwIsValid(c, n));
	for (i = 0; i < n; ++i)
	{
		w = a[i] + carry;
		carry = wordLess01(w, carry);
		diff |= c[i] ^ (w + b[i]);
		carry |= wordLess01(c[i], w);
	}
	w = 0;
	return wordEq(diff | carry, 0);
}